

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O2

bool testing::internal::Base64Unescape(string *encoded,string *decoded)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_type sVar6;
  
  decoded->_M_string_length = 0;
  *(decoded->_M_dataplus)._M_p = '\0';
  std::__cxx11::string::reserve((ulong)decoded);
  pcVar1 = (encoded->_M_dataplus)._M_p;
  sVar2 = encoded->_M_string_length;
  sVar6 = 0;
  uVar5 = 0;
  do {
    if (sVar2 == sVar6) {
LAB_0013256e:
      return sVar2 == sVar6;
    }
    iVar4 = (int)pcVar1[sVar6];
    iVar3 = isspace(iVar4);
    if ((iVar4 != 0x3d) && (iVar3 == 0)) {
      if ('?' < "AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA>A>A?456789:;<=AAAAAAA"[iVar4]) {
        decoded->_M_string_length = 0;
        *(decoded->_M_dataplus)._M_p = '\0';
        goto LAB_0013256e;
      }
      if (uVar5 == 0) {
        uVar5 = 6;
      }
      else {
        std::__cxx11::string::push_back((char)decoded);
        uVar5 = uVar5 + 6 & 7;
      }
    }
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

bool Base64Unescape(const std::string& encoded, std::string* decoded) {
  decoded->clear();
  size_t encoded_len = encoded.size();
  decoded->reserve(3 * (encoded_len / 4) + (encoded_len % 4));
  int bit_pos = 0;
  char dst = 0;
  for (int src : encoded) {
    if (std::isspace(src) || src == '=') {
      continue;
    }
    char src_bin = kUnBase64[static_cast<size_t>(src)];
    if (src_bin >= 64) {
      decoded->clear();
      return false;
    }
    if (bit_pos == 0) {
      dst |= static_cast<char>(src_bin << 2);
      bit_pos = 6;
    } else {
      dst |= static_cast<char>(src_bin >> (bit_pos - 2));
      decoded->push_back(dst);
      dst = static_cast<char>(src_bin << (10 - bit_pos));
      bit_pos = (bit_pos + 6) % 8;
    }
  }
  return true;
}